

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O3

cbtBroadphasePair * __thiscall
cbtSortedOverlappingPairCache::findPair
          (cbtSortedOverlappingPairCache *this,cbtBroadphaseProxy *proxy0,cbtBroadphaseProxy *proxy1
          )

{
  int iVar1;
  cbtOverlapFilterCallback *pcVar2;
  char cVar3;
  cbtBroadphasePair *pcVar4;
  cbtBroadphaseProxy *pcVar5;
  long lVar6;
  
  pcVar2 = this->m_overlapFilterCallback;
  if (pcVar2 == (cbtOverlapFilterCallback *)0x0) {
    if ((proxy0->m_collisionFilterGroup & proxy1->m_collisionFilterMask) == 0) {
      return (cbtBroadphasePair *)0x0;
    }
    if ((proxy1->m_collisionFilterGroup & proxy0->m_collisionFilterMask) == 0) {
      return (cbtBroadphasePair *)0x0;
    }
  }
  else {
    cVar3 = (**(code **)(*(long *)pcVar2 + 0x10))(pcVar2,proxy0,proxy1);
    if (cVar3 == '\0') {
      return (cbtBroadphasePair *)0x0;
    }
  }
  iVar1 = (this->m_overlappingPairArray).m_size;
  pcVar5 = proxy0;
  if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
    pcVar5 = proxy1;
    proxy1 = proxy0;
  }
  if (0 < (long)iVar1) {
    pcVar4 = (this->m_overlappingPairArray).m_data;
    lVar6 = 0;
    do {
      if ((pcVar4->m_pProxy0 == proxy1) && (pcVar4->m_pProxy1 == pcVar5)) {
        if (iVar1 <= (int)lVar6) {
          return (cbtBroadphasePair *)0x0;
        }
        return pcVar4;
      }
      lVar6 = lVar6 + 1;
      pcVar4 = pcVar4 + 1;
    } while (iVar1 != lVar6);
  }
  return (cbtBroadphasePair *)0x0;
}

Assistant:

cbtBroadphasePair* cbtSortedOverlappingPairCache::findPair(cbtBroadphaseProxy* proxy0, cbtBroadphaseProxy* proxy1)
{
	if (!needsBroadphaseCollision(proxy0, proxy1))
		return 0;

	cbtBroadphasePair tmpPair(*proxy0, *proxy1);
	int findIndex = m_overlappingPairArray.findLinearSearch(tmpPair);

	if (findIndex < m_overlappingPairArray.size())
	{
		//cbtAssert(it != m_overlappingPairSet.end());
		cbtBroadphasePair* pair = &m_overlappingPairArray[findIndex];
		return pair;
	}
	return 0;
}